

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O1

TFunction * __thiscall
glslang::TParseContext::findFunctionExact
          (TParseContext *this,TSourceLoc *loc,TFunction *call,bool *builtIn)

{
  TSymbolTable *this_00;
  int iVar1;
  undefined4 extraout_var;
  TSymbol *pTVar2;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  this_00 = (this->super_TParseContextBase).symbolTable;
  iVar1 = (*(call->super_TSymbol)._vptr_TSymbol[6])(call);
  pTVar2 = TSymbolTable::find(this_00,(TString *)CONCAT44(extraout_var,iVar1),builtIn,(bool *)0x0,
                              (int *)0x0);
  if (pTVar2 != (TSymbol *)0x0) {
    iVar1 = (*pTVar2->_vptr_TSymbol[7])(pTVar2);
    return (TFunction *)CONCAT44(extraout_var_00,iVar1);
  }
  iVar1 = (*(call->super_TSymbol)._vptr_TSymbol[3])(call);
  (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
            (this,loc,"no matching overloaded function found",
             *(undefined8 *)(CONCAT44(extraout_var_01,iVar1) + 8),"");
  return (TFunction *)0x0;
}

Assistant:

const TFunction* TParseContext::findFunctionExact(const TSourceLoc& loc, const TFunction& call, bool& builtIn)
{
    TSymbol* symbol = symbolTable.find(call.getMangledName(), &builtIn);
    if (symbol == nullptr) {
        error(loc, "no matching overloaded function found", call.getName().c_str(), "");

        return nullptr;
    }

    return symbol->getAsFunction();
}